

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O3

cmn_type_t cmn_type_from_str(char *str)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  lVar2 = 0;
  while( true ) {
    iVar1 = strcmp(str,*(char **)((long)cmn_type_str + lVar3));
    if (iVar1 == 0) break;
    iVar1 = strcmp(str,*(char **)((long)cmn_alt_type_str + lVar3));
    if (iVar1 == 0) break;
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 8;
    if (lVar2 == 3) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
              ,0x50,"Unknown CMN type \'%s\'\n",str);
      exit(1);
    }
  }
  return (cmn_type_t)lVar2;
}

Assistant:

cmn_type_t
cmn_type_from_str(const char *str)
{
    int i;

    for (i = 0; i < n_cmn_type_str; ++i) {
        if (0 == strcmp(str, cmn_type_str[i]) || 0 == strcmp(str, cmn_alt_type_str[i]))
            return (cmn_type_t)i;
    }
    E_FATAL("Unknown CMN type '%s'\n", str);
    return CMN_NONE;
}